

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr
          (ExceptionOr<kj::HttpClient::ConnectRequest::Status> *this)

{
  if ((this->value).ptr.isSet == true) {
    HttpClient::ConnectRequest::Status::~Status(&(this->value).ptr.field_1.value);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}